

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O1

insert_result __thiscall
tonk::LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::insert
          (LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *this,uint *k,
          IConnection **v)

{
  uint uVar1;
  bool bVar2;
  raw_node *prVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  
  uVar1 = this->m_values_count;
  if (uVar1 == 0) {
    bVar11 = 0;
    uVar7 = 0;
    bVar12 = false;
  }
  else {
    uVar6 = *k;
    uVar8 = uVar6 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
    uVar5 = (ulong)uVar8;
    prVar3 = this->m_values + uVar5;
    if (prVar3->m_bits[0x10] == '\0') {
      uVar7 = 0;
LAB_00120e6e:
      uVar8 = this->m_num_valid;
      bVar11 = 0;
      bVar12 = false;
      if (uVar8 < this->m_grow_threshold) {
        *(uint *)prVar3->m_bits = uVar6;
        *(IConnection **)(prVar3->m_bits + 8) = *v;
        prVar3->m_bits[0x10] = '\x01';
        this->m_num_valid = uVar8 + 1;
        bVar11 = 1;
        bVar12 = true;
        uVar7 = uVar5;
      }
    }
    else if (*(uint *)prVar3->m_bits == uVar6) {
      bVar12 = true;
      bVar11 = 0;
      uVar7 = uVar5;
    }
    else {
      uVar9 = uVar8;
      do {
        bVar12 = uVar9 == 0;
        prVar3 = prVar3 + -1;
        uVar9 = uVar9 - 1;
        if (bVar12) {
          prVar3 = this->m_values + (uVar1 - 1);
          uVar9 = uVar1 - 1;
        }
        bVar2 = uVar8 != uVar9;
        if (uVar8 == uVar9) {
LAB_00120e62:
          uVar7 = 0;
          bVar12 = false;
          goto LAB_00120e67;
        }
        if (prVar3->m_bits[0x10] == '\0') {
          bVar2 = true;
          goto LAB_00120e62;
        }
      } while (*(uint *)prVar3->m_bits != uVar6);
      bVar12 = true;
      bVar2 = false;
      uVar7 = (ulong)uVar9;
LAB_00120e67:
      if (bVar2) {
        uVar5 = (ulong)uVar9;
        goto LAB_00120e6e;
      }
      bVar11 = 0;
    }
  }
  uVar6 = (uint)uVar7;
  if (!bVar12) {
    uVar8 = 4;
    if (4 < uVar1 * 2) {
      uVar8 = uVar1 * 2;
    }
    rehash(this,uVar8);
    if (this->m_values_count != 0) {
      uVar1 = *k;
      uVar8 = uVar1 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
      uVar5 = (ulong)uVar8;
      prVar3 = this->m_values + uVar5;
      if (prVar3->m_bits[0x10] != '\0') {
        if (*(uint *)prVar3->m_bits == uVar1) {
          bVar11 = 0;
          uVar7 = uVar5;
          goto LAB_00120eec;
        }
        uVar10 = (ulong)(this->m_values_count - 1);
        do {
          iVar4 = (int)uVar5;
          uVar5 = (ulong)(iVar4 - 1);
          if (iVar4 == 0) {
            uVar5 = uVar10;
          }
          uVar9 = (uint)uVar5;
          prVar3 = prVar3 + -1;
          if (iVar4 == 0) {
            prVar3 = this->m_values + uVar10;
          }
          bVar12 = uVar8 != uVar9;
          if (uVar8 == uVar9) goto LAB_00120f3f;
          if (prVar3->m_bits[0x10] == '\0') {
            bVar12 = true;
            goto LAB_00120f3f;
          }
        } while (*(uint *)prVar3->m_bits != uVar1);
        bVar11 = 0;
        bVar12 = false;
        uVar7 = uVar5;
LAB_00120f3f:
        uVar6 = (uint)uVar7;
        uVar8 = uVar9;
        if (!bVar12) goto LAB_00120eec;
      }
      uVar9 = this->m_num_valid;
      uVar7 = (ulong)uVar6;
      if (uVar9 < this->m_grow_threshold) {
        *(uint *)prVar3->m_bits = uVar1;
        *(IConnection **)(prVar3->m_bits + 8) = *v;
        prVar3->m_bits[0x10] = '\x01';
        this->m_num_valid = uVar9 + 1;
        bVar11 = 1;
        uVar7 = (ulong)uVar8;
      }
    }
  }
LAB_00120eec:
  return (insert_result)(uVar7 | (ulong)bVar11 << 0x20);
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
    {
        insert_result result;
        if (!insert_no_grow(result, k, v))
        {
            unsigned newSize = m_values_count * 2;
            if (newSize < cMinHashSize) {
                newSize = cMinHashSize;
            }

            rehash(newSize);

            if (!insert_no_grow(result, k, v)) {
                TONK_DEBUG_BREAK();
            }
        }

        return result;
    }